

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::
CommandReenroll(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&)::$_0::~__0
          (__0 *this)

{
  anon_class_72_3_43e17e2a *this_local;
  
  std::__cxx11::string::~string((string *)(this + 0x28));
  std::function<void_(ot::commissioner::Error)>::~function
            ((function<void_(ot::commissioner::Error)> *)(this + 8));
  return;
}

Assistant:

Error CommissionerSafe::CommandReenroll(const std::string &aDstAddr)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    CommandReenroll(wait, aDstAddr);
    return pro.get_future().get();
}